

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Chan::set(V2Chan *this,syVChan *para)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  uVar1 = para->auxarcv;
  uVar2 = para->auxbrcv;
  this->aarcv = (float)uVar1 * 0.0078125;
  this->abrcv = (float)uVar2 * 0.0078125;
  fVar6 = para->chanvol * 0.0078125 * 0.6;
  this->chgain = fVar6;
  fVar6 = fVar6 * 0.6;
  fVar3 = para->auxasnd;
  fVar4 = para->auxbsnd;
  fVar5 = para->aux2;
  this->a1gain = fVar6 * para->aux1 * 0.0078125;
  this->a2gain = fVar6 * fVar5 * 0.0078125;
  this->aasnd = fVar3 * 0.0078125 * 0.6;
  this->absnd = fVar4 * 0.0078125 * 0.6;
  this->fxr = (int)para->fxroute;
  V2Dist::set(&this->dist,&para->dist);
  V2ModDel::set(&this->chorus,&para->chorus);
  V2Comp::set(&this->comp,&para->comp);
  V2Boost::set(&this->boost,&para->boost);
  return;
}

Assistant:

void set(const syVChan *para)
    {
        aarcv = para->auxarcv / 128.0f;
        abrcv = para->auxbrcv / 128.0f;
        aasnd = fcgain * (para->auxasnd / 128.0f);
        absnd = fcgain * (para->auxbsnd / 128.0f);
        chgain = fcgain * (para->chanvol / 128.0f);
        a1gain = chgain * fcgainh * (para->aux1 / 128.0f);
        a2gain = chgain * fcgainh * (para->aux2 / 128.0f);
        fxr = (int)para->fxroute;
        dist.set(&para->dist);
        chorus.set(&para->chorus);
        comp.set(&para->comp);
        boost.set(&para->boost);
    }